

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O0

Node * __thiscall
icu_63::StringTrieBuilder::makeBranchSubNode
          (StringTrieBuilder *this,int32_t start,int32_t limit,int32_t unitIndex,int32_t length,
          UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  uint uVar3;
  uint limit_00;
  Node *pNVar4;
  ListBranchNode *pLVar5;
  undefined4 in_register_00000034;
  size_t size;
  ListBranchNode *local_188;
  ListBranchNode *local_138;
  Node *local_108;
  Node *node;
  UChar unit;
  UChar unit_1;
  int32_t i_1;
  int32_t unitNumber;
  ListBranchNode *listNode;
  int32_t i;
  int32_t ltLength;
  Node *lessThan [14];
  UChar middleUnits [14];
  UErrorCode *errorCode_local;
  int32_t length_local;
  int32_t unitIndex_local;
  int32_t limit_local;
  int32_t start_local;
  StringTrieBuilder *this_local;
  
  size = CONCAT44(in_register_00000034,start);
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 != '\0') {
    return (Node *)0x0;
  }
  listNode._4_4_ = 0;
  unitIndex_local = start;
  for (errorCode_local._0_4_ = length; iVar2 = (*(this->super_UObject)._vptr_UObject[0xb])(),
      iVar2 < (int32_t)errorCode_local;
      errorCode_local._0_4_ = (int32_t)errorCode_local - (int32_t)errorCode_local / 2) {
    uVar3 = (*(this->super_UObject)._vptr_UObject[8])
                      (this,(ulong)(uint)unitIndex_local,(ulong)(uint)unitIndex,
                       (long)(int32_t)errorCode_local / 2 & 0xffffffff);
    iVar2 = (*(this->super_UObject)._vptr_UObject[4])(this,(ulong)uVar3,(ulong)(uint)unitIndex);
    middleUnits[(long)listNode._4_4_ + -4] = (UChar)iVar2;
    size = (size_t)(uint)unitIndex_local;
    pNVar4 = makeBranchSubNode(this,unitIndex_local,uVar3,unitIndex,(int32_t)errorCode_local / 2,
                               errorCode);
    *(Node **)(&i + (long)listNode._4_4_ * 2) = pNVar4;
    listNode._4_4_ = listNode._4_4_ + 1;
    unitIndex_local = uVar3;
  }
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    pLVar5 = (ListBranchNode *)UMemory::operator_new((UMemory *)0x68,size);
    local_138 = (ListBranchNode *)0x0;
    if (pLVar5 != (ListBranchNode *)0x0) {
      ListBranchNode::ListBranchNode(pLVar5);
      local_138 = pLVar5;
    }
    if (local_138 != (ListBranchNode *)0x0) {
      _unit = 0;
      do {
        uVar3 = (*(this->super_UObject)._vptr_UObject[4])
                          (this,(ulong)(uint)unitIndex_local,(ulong)(uint)unitIndex);
        limit_00 = (*(this->super_UObject)._vptr_UObject[9])
                             (this,(ulong)(unitIndex_local + 1),(ulong)(uint)unitIndex,
                              (ulong)(ushort)uVar3);
        if ((unitIndex_local == limit_00 - 1) &&
           (iVar2 = (*(this->super_UObject)._vptr_UObject[3])(this,(ulong)(uint)unitIndex_local),
           unitIndex + 1 == iVar2)) {
          iVar2 = (*(this->super_UObject)._vptr_UObject[5])(this,(ulong)(uint)unitIndex_local);
          ListBranchNode::add(local_138,uVar3 & 0xffff,iVar2);
        }
        else {
          pNVar4 = makeNode(this,unitIndex_local,limit_00,unitIndex + 1,errorCode);
          ListBranchNode::add(local_138,uVar3 & 0xffff,pNVar4);
        }
        _unit = _unit + 1;
        unitIndex_local = limit_00;
      } while (_unit < (int32_t)errorCode_local + -1);
      uVar3 = (*(this->super_UObject)._vptr_UObject[4])(this,(ulong)limit_00,(ulong)(uint)unitIndex)
      ;
      if ((limit_00 == limit - 1U) &&
         (iVar2 = (*(this->super_UObject)._vptr_UObject[3])(this,(ulong)limit_00),
         unitIndex + 1 == iVar2)) {
        iVar2 = (*(this->super_UObject)._vptr_UObject[5])(this,(ulong)limit_00);
        ListBranchNode::add(local_138,uVar3 & 0xffff,iVar2);
      }
      else {
        pNVar4 = makeNode(this,limit_00,limit,unitIndex + 1,errorCode);
        ListBranchNode::add(local_138,uVar3 & 0xffff,pNVar4);
      }
      local_108 = registerNode(this,(Node *)local_138,errorCode);
      while (0 < listNode._4_4_) {
        listNode._4_4_ = listNode._4_4_ + -1;
        pLVar5 = (ListBranchNode *)UMemory::operator_new((UMemory *)0x28,(size_t)local_138);
        local_188 = (ListBranchNode *)0x0;
        if (pLVar5 != (ListBranchNode *)0x0) {
          SplitBranchNode::SplitBranchNode
                    ((SplitBranchNode *)pLVar5,middleUnits[(long)listNode._4_4_ + -4],
                     *(Node **)(&i + (long)listNode._4_4_ * 2),local_108);
          local_188 = pLVar5;
        }
        local_108 = registerNode(this,(Node *)local_188,errorCode);
        local_138 = local_188;
      }
      return local_108;
    }
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
    return (Node *)0x0;
  }
  return (Node *)0x0;
}

Assistant:

StringTrieBuilder::Node *
StringTrieBuilder::makeBranchSubNode(int32_t start, int32_t limit, int32_t unitIndex,
                                   int32_t length, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return NULL;
    }
    UChar middleUnits[kMaxSplitBranchLevels];
    Node *lessThan[kMaxSplitBranchLevels];
    int32_t ltLength=0;
    while(length>getMaxBranchLinearSubNodeLength()) {
        // Branch on the middle unit.
        // First, find the middle unit.
        int32_t i=skipElementsBySomeUnits(start, unitIndex, length/2);
        // Create the less-than branch.
        middleUnits[ltLength]=getElementUnit(i, unitIndex);  // middle unit
        lessThan[ltLength]=makeBranchSubNode(start, i, unitIndex, length/2, errorCode);
        ++ltLength;
        // Continue for the greater-or-equal branch.
        start=i;
        length=length-length/2;
    }
    if(U_FAILURE(errorCode)) {
        return NULL;
    }
    ListBranchNode *listNode=new ListBranchNode();
    if(listNode==NULL) {
        errorCode=U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    // For each unit, find its elements array start and whether it has a final value.
    int32_t unitNumber=0;
    do {
        int32_t i=start;
        UChar unit=getElementUnit(i++, unitIndex);
        i=indexOfElementWithNextUnit(i, unitIndex, unit);
        if(start==i-1 && unitIndex+1==getElementStringLength(start)) {
            listNode->add(unit, getElementValue(start));
        } else {
            listNode->add(unit, makeNode(start, i, unitIndex+1, errorCode));
        }
        start=i;
    } while(++unitNumber<length-1);
    // unitNumber==length-1, and the maxUnit elements range is [start..limit[
    UChar unit=getElementUnit(start, unitIndex);
    if(start==limit-1 && unitIndex+1==getElementStringLength(start)) {
        listNode->add(unit, getElementValue(start));
    } else {
        listNode->add(unit, makeNode(start, limit, unitIndex+1, errorCode));
    }
    Node *node=registerNode(listNode, errorCode);
    // Create the split-branch nodes.
    while(ltLength>0) {
        --ltLength;
        node=registerNode(
            new SplitBranchNode(middleUnits[ltLength], lessThan[ltLength], node), errorCode);
    }
    return node;
}